

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

void __thiscall
dlib::
repeat<3ul,resnet::def<dlib::affine>::resbottleneck_128,dlib::add_layer<dlib::relu_,dlib::add_layer<dlib::add_prev_<dlib::tag2>,dlib::add_layer<dlib::avg_pool_<2l,2l,2,2,0,0>,dlib::add_skip_layer<dlib::tag1,dlib::add_tag_layer<2ul,dlib::add_layer<dlib::affine_,dlib::add_layer<dlib::con_<512l,1l,1l,1,1,0,0>,dlib::add_layer<dlib::relu_,dlib::add_layer<dlib::affine_,dlib::add_layer<dlib::con_<128l,3l,3l,2,2,0,0>,dlib::add_layer<dlib::relu_,dlib::add_layer<dlib::affine_,dlib::add_layer<dlib::con_<128l,1l,1l,1,1,0,0>,dlib::add_tag_layer<1ul,dlib::repeat<3ul,resnet::def<dlib::affine>::resbottleneck_64,dlib::add_layer<dlib::max_pool_<3l,3l,2,2,0,0>,dlib::add_layer<dlib::relu_,dlib::add_layer<dlib::affine_,dlib::add_layer<dlib::con_<64l,7l,7l,2,2,0,0>,dlib::input_rgb_image,void>,void>,void>,void>>,void>,void>,void>,void>,void>,void>,void>,void>,void>,void>>,void>,void>,void>>
::
to_tensor<__gnu_cxx::__normal_iterator<dlib::matrix<dlib::rgb_pixel,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>const*,std::vector<dlib::matrix<dlib::rgb_pixel,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>,std::allocator<dlib::matrix<dlib::rgb_pixel,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>>>>>
          (repeat<3ul,resnet::def<dlib::affine>::resbottleneck_128,dlib::add_layer<dlib::relu_,dlib::add_layer<dlib::add_prev_<dlib::tag2>,dlib::add_layer<dlib::avg_pool_<2l,2l,2,2,0,0>,dlib::add_skip_layer<dlib::tag1,dlib::add_tag_layer<2ul,dlib::add_layer<dlib::affine_,dlib::add_layer<dlib::con_<512l,1l,1l,1,1,0,0>,dlib::add_layer<dlib::relu_,dlib::add_layer<dlib::affine_,dlib::add_layer<dlib::con_<128l,3l,3l,2,2,0,0>,dlib::add_layer<dlib::relu_,dlib::add_layer<dlib::affine_,dlib::add_layer<dlib::con_<128l,1l,1l,1,1,0,0>,dlib::add_tag_layer<1ul,dlib::repeat<3ul,resnet::def<dlib::affine>::resbottleneck_64,dlib::add_layer<dlib::max_pool_<3l,3l,2,2,0,0>,dlib::add_layer<dlib::relu_,dlib::add_layer<dlib::affine_,dlib::add_layer<dlib::con_<64l,7l,7l,2,2,0,0>,dlib::input_rgb_image,void>,void>,void>,void>>,void>,void>,void>,void>,void>,void>,void>,void>,void>,void>>,void>,void>,void>>
           *this,__normal_iterator<const_dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_*,_std::vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
                 ibegin,
          __normal_iterator<const_dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_*,_std::vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
          iend,resizable_tensor *data)

{
  long lVar1;
  add_layer<dlib::relu_,_dlib::add_layer<dlib::add_prev_<dlib::tag1>,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>
  *d;
  long lVar2;
  
  repeat<3ul,resnet::def<dlib::affine>::resbottleneck_64,dlib::add_layer<dlib::max_pool_<3l,3l,2,2,0,0>,dlib::add_layer<dlib::relu_,dlib::add_layer<dlib::affine_,dlib::add_layer<dlib::con_<64l,7l,7l,2,2,0,0>,dlib::input_rgb_image,void>,void>,void>,void>>
  ::
  to_tensor<__gnu_cxx::__normal_iterator<dlib::matrix<dlib::rgb_pixel,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>const*,std::vector<dlib::matrix<dlib::rgb_pixel,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>,std::allocator<dlib::matrix<dlib::rgb_pixel,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>>>>>
            (*(repeat<3ul,resnet::def<dlib::affine>::resbottleneck_64,dlib::add_layer<dlib::max_pool_<3l,3l,2,2,0,0>,dlib::add_layer<dlib::relu_,dlib::add_layer<dlib::affine_,dlib::add_layer<dlib::con_<64l,7l,7l,2,2,0,0>,dlib::input_rgb_image,void>,void>,void>,void>>
               **)(*(long *)(*(long *)(*(long *)(*(long *)(*(long *)(*(long *)(*(long *)(*(long *)(*
                                                  (long *)(*(long *)(this + 0xb8) + 0x98) + 0xc0) +
                                                  0x1c8) + 0x180) + 0xa0) + 0x1c8) + 0x180) + 0xa0)
                            + 0x1c8) + 0x180),ibegin,iend,data);
  lVar1 = *(long *)(this + 8);
  for (lVar2 = *(long *)this; lVar2 != lVar1; lVar2 = lVar2 + 0x310) {
    add_tag_layer<1ul,dlib::impl::repeat_input_layer,void>::
    to_tensor<__gnu_cxx::__normal_iterator<dlib::matrix<dlib::rgb_pixel,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>const*,std::vector<dlib::matrix<dlib::rgb_pixel,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>,std::allocator<dlib::matrix<dlib::rgb_pixel,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>>>>>
              (*(add_tag_layer<1ul,dlib::impl::repeat_input_layer,void> **)
                (*(long *)(*(long *)(*(long *)(*(long *)(*(long *)(*(long *)(*(long *)(*(long *)(*(
                                                  long *)(lVar2 + 0xa0) + 0x98) + 0x1c8) + 0x180) +
                                                  0xa0) + 0x1c8) + 0x180) + 0xa0) + 0x1c8) + 0x180),
               ibegin,iend,data);
  }
  return;
}

Assistant:

void to_tensor (
            forward_iterator ibegin,
            forward_iterator iend,
            resizable_tensor& data
        ) const
        {
            subnetwork.to_tensor(ibegin,iend,data);
            // call to_tensor on the networks in details just to populate the
            // _sample_expansion_factor values in those networks.  Other than that this
            // call is a noop.  
            for (auto& d : details)
                d.to_tensor(ibegin, iend, data);
        }